

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamFtp_p.cpp
# Opt level: O2

void __thiscall BamTools::Internal::BamFtp::ParseUrl(BamFtp *this,string *url)

{
  int iVar1;
  long lVar2;
  size_t i;
  size_type sVar3;
  string tempUrl;
  string filename;
  string out;
  string hostname;
  
  this->m_isUrlParsed = false;
  std::__cxx11::string::string((string *)&tempUrl,(string *)url);
  out._M_dataplus._M_p = (pointer)&out.field_2;
  out._M_string_length = 0;
  out.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)&out);
  for (sVar3 = 0; tempUrl._M_string_length != sVar3; sVar3 = sVar3 + 1) {
    iVar1 = tolower((int)tempUrl._M_dataplus._M_p[sVar3]);
    out._M_dataplus._M_p[sVar3] = (char)iVar1;
  }
  std::__cxx11::string::~string((string *)&out);
  lVar2 = std::__cxx11::string::find((string *)&tempUrl,0x1f6508);
  if (lVar2 != -1) {
    std::__cxx11::string::find((char)&tempUrl,0x2f);
    std::__cxx11::string::substr((ulong)&hostname,(ulong)&tempUrl);
    std::__cxx11::string::_M_assign((string *)&this->m_hostname);
    this->m_port = 0x15;
    std::__cxx11::string::substr((ulong)&filename,(ulong)&tempUrl);
    if (filename._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&this->m_filename);
      this->m_isUrlParsed = true;
    }
    std::__cxx11::string::~string((string *)&filename);
    std::__cxx11::string::~string((string *)&hostname);
  }
  std::__cxx11::string::~string((string *)&tempUrl);
  return;
}

Assistant:

void BamFtp::ParseUrl(const std::string& url)
{

    // clear flag to start
    m_isUrlParsed = false;

    // make sure url starts with "ftp://", case-insensitive
    std::string tempUrl(url);
    toLower(tempUrl);
    const std::size_t prefixFound = tempUrl.find(FTP_PREFIX);
    if (prefixFound == std::string::npos) return;

    // find end of host name portion (first '/' hit after the prefix)
    const std::size_t firstSlashFound = tempUrl.find(HOST_SEPARATOR, FTP_PREFIX_LENGTH);
    if (firstSlashFound == std::string::npos) {
        ;  // no slash found... no filename given along with host?
    }

    // fetch hostname
    std::string hostname = tempUrl.substr(FTP_PREFIX_LENGTH, (firstSlashFound - FTP_PREFIX_LENGTH));
    m_hostname = hostname;
    m_port = FTP_PORT;

    // store remainder of URL as filename (must be non-empty)
    std::string filename = tempUrl.substr(firstSlashFound);
    if (filename.empty()) return;
    m_filename = filename;

    // set parsed OK flag
    m_isUrlParsed = true;
}